

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseExtend
          (Parser *this,RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *extend_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  FieldDescriptorProto *this_00;
  LocationRecorder extendee_location;
  LocationRecorder location;
  string extendee;
  Token extendee_end;
  Token extendee_start;
  
  bVar1 = Consume(this,"extend");
  if (bVar1) {
    io::Tokenizer::Token::Token(&extendee_start,&this->input_->current_);
    extendee._M_dataplus._M_p = (pointer)&extendee.field_2;
    extendee._M_string_length = 0;
    extendee.field_2._M_local_buf[0] = '\0';
    bVar1 = ParseUserDefinedType(this,&extendee);
    if (bVar1) {
      io::Tokenizer::Token::Token(&extendee_end,&this->input_->previous_);
      bVar1 = ConsumeEndOfDeclaration(this,"{",extend_location);
      if (bVar1) {
        bVar1 = true;
        do {
          if ((this->input_->current_).type == TYPE_END) {
            std::__cxx11::string::string
                      ((string *)&location,
                       "Reached end of input in extend definition (missing \'}\').",
                       (allocator *)&extendee_location);
            AddError(this,(string *)&location);
            std::__cxx11::string::~string((string *)&location);
            goto LAB_002d5c51;
          }
          LocationRecorder::LocationRecorder
                    (&location,extend_location,
                     (extensions->super_RepeatedPtrFieldBase).current_size_);
          this_00 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(extensions);
          LocationRecorder::LocationRecorder(&extendee_location,&location,2);
          LocationRecorder::StartAt(&extendee_location,&extendee_start);
          LocationRecorder::EndAt(&extendee_location,&extendee_end);
          if (bVar1) {
            LocationRecorder::RecordLegacyLocation
                      (&extendee_location,&this_00->super_Message,EXTENDEE);
          }
          LocationRecorder::~LocationRecorder(&extendee_location);
          FieldDescriptorProto::set_extendee(this_00,&extendee);
          bVar1 = ParseMessageField(this,this_00,messages,parent_location,
                                    location_field_number_for_nested_type,&location,containing_file)
          ;
          if (!bVar1) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&location);
          bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
          bVar1 = false;
        } while (!bVar2);
        bVar1 = true;
      }
      else {
LAB_002d5c51:
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&extendee_end.text);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&extendee);
    std::__cxx11::string::~string((string *)&extendee_start.text);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseExtend(RepeatedPtrField<FieldDescriptorProto>* extensions,
                         RepeatedPtrField<DescriptorProto>* messages,
                         const LocationRecorder& parent_location,
                         int location_field_number_for_nested_type,
                         const LocationRecorder& extend_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("extend"));

  // Parse the extendee type.
  io::Tokenizer::Token extendee_start = input_->current();
  string extendee;
  DO(ParseUserDefinedType(&extendee));
  io::Tokenizer::Token extendee_end = input_->previous();

  // Parse the block.
  DO(ConsumeEndOfDeclaration("{", &extend_location));

  bool is_first = true;

  do {
    if (AtEnd()) {
      AddError("Reached end of input in extend definition (missing '}').");
      return false;
    }

    // Note that kExtensionFieldNumber was already pushed by the parent.
    LocationRecorder location(extend_location, extensions->size());

    FieldDescriptorProto* field = extensions->Add();

    {
      LocationRecorder extendee_location(
          location, FieldDescriptorProto::kExtendeeFieldNumber);
      extendee_location.StartAt(extendee_start);
      extendee_location.EndAt(extendee_end);

      if (is_first) {
        extendee_location.RecordLegacyLocation(
            field, DescriptorPool::ErrorCollector::EXTENDEE);
        is_first = false;
      }
    }

    field->set_extendee(extendee);

    if (!ParseMessageField(field, messages, parent_location,
                           location_field_number_for_nested_type,
                           location,
                           containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}